

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O1

_Bool ggml_thread_apply_affinity(_Bool *mask)

{
  FILE *__stream;
  uint32_t i;
  uint __errnum;
  ulong uVar1;
  pthread_t __th;
  char *pcVar2;
  cpu_set_t cpuset;
  cpu_set_t local_98;
  
  local_98.__bits[8] = 0;
  local_98.__bits[9] = 0;
  local_98.__bits[10] = 0;
  local_98.__bits[0xb] = 0;
  local_98.__bits[0xc] = 0;
  local_98.__bits[0xd] = 0;
  local_98.__bits[0xe] = 0;
  local_98.__bits[0xf] = 0;
  local_98.__bits[0] = 0;
  local_98.__bits[1] = 0;
  local_98.__bits[2] = 0;
  local_98.__bits[3] = 0;
  local_98.__bits[4] = 0;
  local_98.__bits[5] = 0;
  local_98.__bits[6] = 0;
  local_98.__bits[7] = 0;
  uVar1 = 0;
  do {
    if (mask[uVar1] == true) {
      local_98.__bits[uVar1 >> 6] = local_98.__bits[uVar1 >> 6] | 1L << (uVar1 & 0x3f);
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x200);
  __th = pthread_self();
  __errnum = pthread_setaffinity_np(__th,0x80,&local_98);
  __stream = _stderr;
  if (__errnum != 0) {
    pcVar2 = strerror(__errnum);
    __errnum = fprintf(__stream,"warn: failed to set affinity mask 0x%llx : %s (%d)\n",mask,pcVar2,
                       (ulong)__errnum);
  }
  return SUB41(__errnum,0);
}

Assistant:

static bool ggml_thread_apply_affinity(const bool * mask) {
    cpu_set_t cpuset;
    int err;

    CPU_ZERO(&cpuset);

    for (uint32_t i = 0; i < GGML_MAX_N_THREADS; i++) {
        if (mask[i]) {
            GGML_PRINT_DEBUG("Thread %lx: adding %d to cpuset\n", pthread_self(), i);
            CPU_SET(i, &cpuset);
        }
    }

#ifdef __ANDROID__
    err = sched_setaffinity(0, sizeof(cpuset), &cpuset);
    if (err < 0) {
        err = errno;
    }
#else
    err = pthread_setaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
#endif
    if (err != 0) {
        fprintf(stderr, "warn: failed to set affinity mask 0x%llx : %s (%d)\n", (unsigned long long)mask, strerror(err), err);
        return false;
    }

    return true;
}